

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

Population * __thiscall
Population::selection(Population *__return_storage_ptr__,Population *this,int generation)

{
  result_type rVar1;
  long lVar2;
  reference __x;
  uint uVar3;
  undefined1 auVar4 [16];
  vector<Chromosome,_std::allocator<Chromosome>_> new_chromosomes;
  vector<Chromosome,_std::allocator<Chromosome>_> local_58;
  exponential_distribution<double> distribution;
  default_random_engine generator;
  
  generator._M_x = 1;
  distribution._M_param._M_lambda = (param_type)(double)((float)generation / 300.0 + 0.5);
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  do {
    do {
      if ((ulong)(((long)(this->chromosomes).
                         super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->chromosomes).
                        super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x60) <= (ulong)uVar3) {
        std::vector<Chromosome,_std::allocator<Chromosome>_>::vector(&local_58,&new_chromosomes);
        Population(__return_storage_ptr__,&local_58);
        std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_58);
        std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&new_chromosomes);
        return __return_storage_ptr__;
      }
      rVar1 = std::exponential_distribution<double>::operator()(&distribution,&generator);
    } while (1.0 <= rVar1);
    lVar2 = ((long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x60;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    __x = std::vector<Chromosome,_std::allocator<Chromosome>_>::at
                    (&this->chromosomes,
                     (long)(int)(rVar1 * ((auVar4._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)lVar2) -
                                         4503599627370496.0))));
    uVar3 = uVar3 + 1;
    std::vector<Chromosome,_std::allocator<Chromosome>_>::push_back(&new_chromosomes,__x);
  } while( true );
}

Assistant:

Population Population::selection(int generation) {

    std::default_random_engine generator;

    float ex = (float) (0.5 + (generation / 300.0));
    std::exponential_distribution<double> distribution(ex);

    std::vector<Chromosome> new_chromosomes;

    for(int i = 0; i < chromosomes.size();){
        double number = distribution(generator);
        if (number<1.0){
            i++;
            int position = int(chromosomes.size()*number);
            new_chromosomes.push_back(chromosomes.at(position));
        }
    }

    return Population(new_chromosomes);
}